

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall QString::replace(QString *this,qsizetype pos,qsizetype len,QString *after)

{
  QChar *after_00;
  qsizetype alen;
  QString *pQVar1;
  
  after_00 = (QChar *)(after->d).ptr;
  alen = (after->d).size;
  if (after_00 == (QChar *)0x0) {
    pQVar1 = replace(this,pos,len,(QChar *)L"",alen);
    return pQVar1;
  }
  pQVar1 = replace(this,pos,len,after_00,alen);
  return pQVar1;
}

Assistant:

QString &QString::replace(qsizetype pos, qsizetype len, const QString &after)
{
    return replace(pos, len, after.constData(), after.size());
}